

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

char * el::LevelHelper::convertToString(Level level)

{
  undefined2 in_register_0000003a;
  
  switch(CONCAT22(in_register_0000003a,level)) {
  case 1:
    return "GLOBAL";
  case 2:
    return "TRACE";
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0011f139_caseD_3;
  case 4:
    return "DEBUG";
  case 8:
    return "FATAL";
  default:
    if (CONCAT22(in_register_0000003a,level) == 0x10) {
      return "ERROR";
    }
    if (CONCAT22(in_register_0000003a,level) == 0x20) {
      return "WARNING";
    }
    if (CONCAT22(in_register_0000003a,level) == 0x40) {
      return "VERBOSE";
    }
    if (CONCAT22(in_register_0000003a,level) == 0x80) {
      return "INFO";
    }
switchD_0011f139_caseD_3:
    return "UNKNOWN";
  }
}

Assistant:

static const char* convertToString(Level level) {
       // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
        if (level == Level::Global) return "GLOBAL";
        if (level == Level::Debug) return "DEBUG";
        if (level == Level::Info) return "INFO";
        if (level == Level::Warning) return "WARNING";
        if (level == Level::Error) return "ERROR";
        if (level == Level::Fatal) return "FATAL";
        if (level == Level::Verbose) return "VERBOSE";
        if (level == Level::Trace) return "TRACE";
        return "UNKNOWN";
    }